

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

RowGroupPointer * __thiscall
duckdb::RowGroup::Checkpoint
          (RowGroupPointer *__return_storage_ptr__,RowGroup *this,RowGroupWriteData *write_data,
          RowGroupWriter *writer,TableStatistics *global_stats)

{
  pointer *ppMVar1;
  pointer puVar2;
  iterator __position;
  pointer pMVar3;
  int iVar4;
  reference this_00;
  type this_01;
  BaseStatistics *this_02;
  reference other;
  undefined4 extraout_var;
  pointer pCVar5;
  undefined4 extraout_var_00;
  pointer this_03;
  size_type __n;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  lock;
  MetaBlockPointer pointer;
  PersistentColumnData persistent_data;
  BinarySerializer serializer;
  undefined1 local_618 [32];
  undefined1 local_5f8 [16];
  SerializationOptions local_5e8;
  PersistentColumnData local_5a8;
  undefined1 local_568 [8];
  pointer pMStack_560;
  _Alloc_hider local_558;
  vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  local_2c0;
  _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
  local_2a0;
  _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
  local_250;
  _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
  local_200;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_1b0;
  _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
  local_160;
  _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
  local_110;
  _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
  local_c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_70;
  
  (__return_storage_ptr__->deletes_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->deletes_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->data_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->deletes_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_618._8_8_ = writer;
  TableStatistics::GetLock((TableStatistics *)local_618);
  if ((this->columns).
      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      .
      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->columns).
      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      .
      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
      ::operator*((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
                   *)local_618);
      this_00 = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator[]
                          (&global_stats->column_stats,__n);
      this_01 = shared_ptr<duckdb::ColumnStatistics,_true>::operator*(this_00);
      this_02 = ColumnStatistics::Statistics(this_01);
      other = vector<duckdb::BaseStatistics,_true>::operator[](&write_data->statistics,__n);
      BaseStatistics::Merge(this_02,other);
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->columns).
                                 super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->columns).
                                 super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  __return_storage_ptr__->row_start = (this->super_SegmentBase<duckdb::RowGroup>).start;
  __return_storage_ptr__->tuple_count =
       (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i;
  this_03 = (write_data->states).
            super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (write_data->states).
           super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_03 != puVar2) {
    local_618._16_8_ = &__return_storage_ptr__->data_pointers;
    local_618._24_8_ = &PTR__BinarySerializer_02490c50;
    do {
      iVar4 = (*(*(_func_int ***)local_618._8_8_)[3])();
      local_5f8 = (undefined1  [16])
                  MetadataWriter::GetMetaBlockPointer
                            ((MetadataWriter *)CONCAT44(extraout_var,iVar4));
      __position._M_current =
           (__return_storage_ptr__->data_pointers).
           super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
           super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->data_pointers).
          super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
          super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::MetaBlockPointer,std::allocator<duckdb::MetaBlockPointer>>::
        _M_realloc_insert<duckdb::MetaBlockPointer_const&>
                  ((vector<duckdb::MetaBlockPointer,std::allocator<duckdb::MetaBlockPointer>> *)
                   local_618._16_8_,__position,(MetaBlockPointer *)local_5f8);
      }
      else {
        (__position._M_current)->block_pointer = local_5f8._0_8_;
        (__position._M_current)->offset = local_5f8._8_4_;
        (__position._M_current)->unused_padding = local_5f8._12_4_;
        ppMVar1 = &(__return_storage_ptr__->data_pointers).
                   super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                   .
                   super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
      pCVar5 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
               ::operator->(this_03);
      (*pCVar5->_vptr_ColumnCheckpointState[5])(&local_5a8,pCVar5);
      local_5e8.serialize_enum_as_string = false;
      local_5e8.serialize_default_values = false;
      local_5e8._2_6_ = 0;
      local_5e8.serialization_compatibility.duckdb_version._M_dataplus._M_p = (pointer)0x0;
      local_5e8.serialization_compatibility.duckdb_version._M_string_length = 0;
      local_5e8.serialization_compatibility.duckdb_version.field_2._M_allocated_capacity = 0;
      local_5e8.serialization_compatibility.duckdb_version.field_2._8_8_ = 0;
      local_5e8.serialization_compatibility.serialization_version = 0;
      local_5e8.serialization_compatibility.manually_set = false;
      local_5e8.serialization_compatibility._41_7_ = 0;
      SerializationCompatibility::Default();
      BinarySerializer::BinarySerializer
                ((BinarySerializer *)local_568,(WriteStream *)CONCAT44(extraout_var,iVar4),
                 &local_5e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8.serialization_compatibility.duckdb_version._M_dataplus._M_p !=
          &local_5e8.serialization_compatibility.duckdb_version.field_2) {
        operator_delete(local_5e8.serialization_compatibility.duckdb_version._M_dataplus._M_p);
      }
      BinarySerializer::OnObjectBegin((BinarySerializer *)local_568);
      PersistentColumnData::Serialize(&local_5a8,(Serializer *)local_568);
      BinarySerializer::OnObjectEnd((BinarySerializer *)local_568);
      local_568 = (undefined1  [8])local_618._24_8_;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_70);
      ::std::
      _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
      ::~_Deque_base(&local_c0);
      ::std::
      _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
      ::~_Deque_base(&local_110);
      ::std::
      _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
      ::~_Deque_base(&local_160);
      ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_1b0);
      ::std::
      _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
      ::~_Deque_base(&local_200);
      ::std::
      _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
      ::~_Deque_base(&local_250);
      ::std::
      _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
      ::~_Deque_base(&local_2a0);
      ::std::
      vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
      ::~vector(&local_2c0);
      Serializer::~Serializer((Serializer *)local_568);
      PersistentColumnData::~PersistentColumnData(&local_5a8);
      this_03 = this_03 + 1;
    } while (this_03 != puVar2);
  }
  iVar4 = (*(*(_func_int ***)local_618._8_8_)[3])();
  CheckpointDeletes((vector<duckdb::MetaBlockPointer,_true> *)local_568,this,
                    *(MetadataManager **)(CONCAT44(extraout_var_00,iVar4) + 8));
  pMVar3 = (__return_storage_ptr__->deletes_pointers).
           super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
           super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->deletes_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_568;
  (__return_storage_ptr__->deletes_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = pMStack_560;
  (__return_storage_ptr__->deletes_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_558._M_p;
  local_568 = (undefined1  [8])0x0;
  pMStack_560 = (pointer)0x0;
  local_558._M_p = (pointer)0x0;
  if (pMVar3 != (pointer)0x0) {
    operator_delete(pMVar3);
  }
  if (local_568 != (undefined1  [8])0x0) {
    operator_delete((void *)local_568);
  }
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
                 *)local_618);
  return __return_storage_ptr__;
}

Assistant:

RowGroupPointer RowGroup::Checkpoint(RowGroupWriteData write_data, RowGroupWriter &writer,
                                     TableStatistics &global_stats) {
	RowGroupPointer row_group_pointer;

	auto lock = global_stats.GetLock();
	for (idx_t column_idx = 0; column_idx < GetColumnCount(); column_idx++) {
		global_stats.GetStats(*lock, column_idx).Statistics().Merge(write_data.statistics[column_idx]);
	}

	// construct the row group pointer and write the column meta data to disk
	D_ASSERT(write_data.states.size() == columns.size());
	row_group_pointer.row_start = start;
	row_group_pointer.tuple_count = count;
	for (auto &state : write_data.states) {
		// get the current position of the table data writer
		auto &data_writer = writer.GetPayloadWriter();
		auto pointer = data_writer.GetMetaBlockPointer();

		// store the stats and the data pointers in the row group pointers
		row_group_pointer.data_pointers.push_back(pointer);

		// Write pointers to the column segments.
		//
		// Just as above, the state can refer to many other states, so this
		// can cascade recursively into more pointer writes.
		auto persistent_data = state->ToPersistentData();
		BinarySerializer serializer(data_writer);
		serializer.Begin();
		persistent_data.Serialize(serializer);
		serializer.End();
	}
	row_group_pointer.deletes_pointers = CheckpointDeletes(writer.GetPayloadWriter().GetManager());
	Verify();
	return row_group_pointer;
}